

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O0

int coda_ascbin_cursor_get_bit_size(coda_cursor_conflict *cursor,int64_t *bit_size)

{
  int iVar1;
  coda_dynamic_type *pcVar2;
  long *in_FS_OFFSET;
  coda_type *local_9b8;
  long local_9b0;
  int64_t element_bit_size;
  long i_1;
  int64_t array_bit_size;
  coda_cursor_conflict array_cursor;
  long num_elements;
  coda_type_array *array;
  long lStack_670;
  int available;
  int64_t field_bit_size;
  int64_t rel_bit_offset;
  long i;
  coda_cursor_conflict field_cursor_1;
  int64_t record_bit_size;
  coda_cursor_conflict field_cursor;
  coda_type_record *record;
  coda_type *type;
  int64_t *bit_size_local;
  coda_cursor_conflict *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_9b8 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_9b8 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  if (local_9b8->bit_size < 0) {
    if (local_9b8->type_class == 0) {
      field_cursor.stack[0x1f].bit_offset = (int64_t)local_9b8;
      if ((*(int *)(*in_FS_OFFSET + -0x1200) == 0) ||
         (local_9b8->size_expr == (coda_expression *)0x0)) {
        if (local_9b8[1].attributes == (coda_type_record *)0x0) {
          field_cursor_1.stack[0x1f].bit_offset = 0;
          if (0 < (long)local_9b8[1].name) {
            memcpy(&i,cursor,0x310);
            iVar1 = coda_cursor_goto_first_record_field((coda_cursor_conflict *)&i);
            if (iVar1 != 0) {
              return -1;
            }
            for (rel_bit_offset = 0;
                rel_bit_offset < *(long *)(field_cursor.stack[0x1f].bit_offset + 0x48);
                rel_bit_offset = rel_bit_offset + 1) {
              lStack_670 = -1;
              if ((rel_bit_offset < *(long *)(field_cursor.stack[0x1f].bit_offset + 0x48) + -1) &&
                 (iVar1 = get_next_relative_field_bit_offset
                                    ((coda_cursor_conflict *)&i,&field_bit_size,
                                     &stack0xfffffffffffff990), iVar1 != 0)) {
                return -1;
              }
              if ((lStack_670 < 0) &&
                 (iVar1 = coda_cursor_get_bit_size
                                    ((coda_cursor_conflict *)&i,&stack0xfffffffffffff990),
                 iVar1 != 0)) {
                return -1;
              }
              field_cursor_1.stack[0x1f].bit_offset =
                   lStack_670 + field_cursor_1.stack[0x1f].bit_offset;
              if (rel_bit_offset < *(long *)(field_cursor.stack[0x1f].bit_offset + 0x48) + -1) {
                array._4_4_ = 1;
                if ((*(long *)(*(long *)(*(long *)(field_cursor.stack[0x1f].bit_offset + 0x50) + 8 +
                                        rel_bit_offset * 8) + 0x20) != 0) &&
                   (iVar1 = coda_expression_eval_bool
                                      (*(coda_expression **)
                                        (*(long *)(*(long *)(field_cursor.stack[0x1f].bit_offset +
                                                            0x50) + 8 + rel_bit_offset * 8) + 0x20),
                                       cursor,(int *)((long)&array + 4)), iVar1 != 0)) {
                  return -1;
                }
                if (array._4_4_ == 0) {
                  pcVar2 = coda_no_data_singleton
                                     (*(coda_format *)field_cursor.stack[0x1f].bit_offset);
                  field_cursor_1.stack[(long)((int)field_cursor_1.product + -1) + -1].bit_offset =
                       (int64_t)pcVar2;
                }
                else {
                  field_cursor_1.stack[(long)((int)field_cursor_1.product + -1) + -1].bit_offset =
                       *(int64_t *)
                        (*(long *)(*(long *)(field_cursor.stack[0x1f].bit_offset + 0x50) + 8 +
                                  rel_bit_offset * 8) + 0x10);
                }
                field_cursor_1.stack[(int)field_cursor_1.product + -1].type =
                     (coda_dynamic_type_struct *)(rel_bit_offset + 1);
                field_cursor_1.stack[(int)field_cursor_1.product + -1].index =
                     cursor->stack[cursor->n + -1].bit_offset + field_bit_size;
              }
            }
          }
          *bit_size = field_cursor_1.stack[0x1f].bit_offset;
        }
        else {
          memcpy(&record_bit_size,cursor,0x310);
          iVar1 = coda_cursor_goto_available_union_field((coda_cursor_conflict *)&record_bit_size);
          if (iVar1 != 0) {
            return -1;
          }
          iVar1 = coda_cursor_get_bit_size((coda_cursor_conflict *)&record_bit_size,bit_size);
          if (iVar1 != 0) {
            return -1;
          }
        }
      }
      else {
        iVar1 = coda_expression_eval_integer(local_9b8->size_expr,cursor,bit_size);
        if (iVar1 != 0) {
          coda_add_error_message(" for size expression");
          coda_cursor_add_to_error_message(cursor);
          return -1;
        }
        if (*(long *)(field_cursor.stack[0x1f].bit_offset + 0x20) == -8) {
          *bit_size = *bit_size << 3;
        }
        if (*bit_size < 0) {
          coda_set_error(-300,"calculated size is negative (%ld bits)",*bit_size);
          coda_cursor_add_to_error_message(cursor);
          return -1;
        }
      }
    }
    else {
      if (local_9b8->type_class != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                      ,0x300,"int coda_ascbin_cursor_get_bit_size(const coda_cursor *, int64_t *)");
      }
      iVar1 = coda_cursor_get_num_elements(cursor,&array_cursor.stack[0x1f].bit_offset);
      if (iVar1 != 0) {
        return -1;
      }
      if (array_cursor.stack[0x1f].bit_offset == 0) {
        *bit_size = 0;
      }
      else if ((*(coda_type **)(local_9b8 + 1))->bit_size < 0) {
        i_1 = 0;
        memcpy(&array_bit_size,cursor,0x310);
        array_cursor.stack[(int)array_cursor.product].index =
             array_cursor.stack[(int)array_cursor.product + -1].index;
        array_cursor.product._0_4_ = (int)array_cursor.product + 1;
        for (element_bit_size = 0; element_bit_size < array_cursor.stack[0x1f].bit_offset;
            element_bit_size = element_bit_size + 1) {
          array_cursor.stack[(long)((int)array_cursor.product + -1) + -1].bit_offset =
               (int64_t)*(coda_type **)(local_9b8 + 1);
          array_cursor.stack[(int)array_cursor.product + -1].type =
               (coda_dynamic_type_struct *)element_bit_size;
          iVar1 = coda_cursor_get_bit_size((coda_cursor_conflict *)&array_bit_size,&local_9b0);
          if (iVar1 != 0) {
            return -1;
          }
          i_1 = local_9b0 + i_1;
          array_cursor.stack[(int)array_cursor.product + -1].index =
               local_9b0 + array_cursor.stack[(int)array_cursor.product + -1].index;
        }
        *bit_size = i_1;
      }
      else {
        *bit_size = array_cursor.stack[0x1f].bit_offset * (*(coda_type **)(local_9b8 + 1))->bit_size
        ;
      }
    }
  }
  else {
    *bit_size = local_9b8->bit_size;
  }
  return 0;
}

Assistant:

int coda_ascbin_cursor_get_bit_size(const coda_cursor *cursor, int64_t *bit_size)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if (type->bit_size >= 0)
    {
        *bit_size = type->bit_size;
    }
    else
    {
        switch (type->type_class)
        {
            case coda_record_class:
                {
                    coda_type_record *record = (coda_type_record *)type;

                    if (coda_option_use_fast_size_expressions && record->size_expr != NULL)
                    {
                        if (coda_expression_eval_integer(record->size_expr, cursor, bit_size) != 0)
                        {
                            coda_add_error_message(" for size expression");
                            coda_cursor_add_to_error_message(cursor);
                            return -1;
                        }
                        if (record->bit_size == -8)
                        {
                            /* convert 'byte size' to 'bit size' */
                            *bit_size *= 8;
                        }
                        if (*bit_size < 0)
                        {
                            coda_set_error(CODA_ERROR_PRODUCT, "calculated size is negative (%ld bits)",
                                           (long)*bit_size);
                            coda_cursor_add_to_error_message(cursor);
                            return -1;
                        }
                    }
                    else if (record->union_field_expr != NULL)
                    {
                        coda_cursor field_cursor;

                        field_cursor = *cursor;
                        if (coda_cursor_goto_available_union_field(&field_cursor) != 0)
                        {
                            return -1;
                        }
                        if (coda_cursor_get_bit_size(&field_cursor, bit_size) != 0)
                        {
                            return -1;
                        }
                    }
                    else
                    {
                        int64_t record_bit_size;

                        record_bit_size = 0;
                        if (record->num_fields > 0)
                        {
                            coda_cursor field_cursor;
                            long i;

                            field_cursor = *cursor;
                            if (coda_cursor_goto_first_record_field(&field_cursor) != 0)
                            {
                                return -1;
                            }
                            for (i = 0; i < record->num_fields; i++)
                            {
                                int64_t rel_bit_offset;
                                int64_t field_bit_size;

                                field_bit_size = -1;
                                if (i < record->num_fields - 1)
                                {
                                    if (get_next_relative_field_bit_offset(&field_cursor, &rel_bit_offset,
                                                                           &field_bit_size) != 0)
                                    {
                                        return -1;
                                    }
                                }
                                if (field_bit_size < 0)
                                {
                                    if (coda_cursor_get_bit_size(&field_cursor, &field_bit_size) != 0)
                                    {
                                        return -1;
                                    }
                                }
                                record_bit_size += field_bit_size;
                                if (i < record->num_fields - 1)
                                {
                                    int available = 1;

                                    if (record->field[i + 1]->available_expr != NULL)
                                    {
                                        if (coda_expression_eval_bool(record->field[i + 1]->available_expr, cursor,
                                                                      &available) != 0)
                                        {
                                            return -1;
                                        }
                                    }
                                    if (available)
                                    {
                                        field_cursor.stack[field_cursor.n - 1].type =
                                            (coda_dynamic_type *)record->field[i + 1]->type;
                                    }
                                    else
                                    {
                                        field_cursor.stack[field_cursor.n - 1].type =
                                            coda_no_data_singleton(record->format);
                                    }
                                    field_cursor.stack[field_cursor.n - 1].index = i + 1;
                                    field_cursor.stack[field_cursor.n - 1].bit_offset =
                                        cursor->stack[cursor->n - 1].bit_offset + rel_bit_offset;
                                }
                            }
                        }
                        *bit_size = record_bit_size;
                    }
                }
                break;
            case coda_array_class:
                {
                    coda_type_array *array = (coda_type_array *)type;
                    long num_elements;

                    /* get the number of elements in array */
                    if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
                    {
                        return -1;
                    }

                    if (num_elements == 0)
                    {
                        /* empty array */
                        *bit_size = 0;
                    }
                    else if (array->base_type->bit_size >= 0)
                    {
                        /* the basetype has a constant size. */
                        *bit_size = num_elements * array->base_type->bit_size;
                    }
                    else
                    {
                        coda_cursor array_cursor;
                        int64_t array_bit_size;
                        long i;

                        /* sum the sizes of the elements 'manually' */
                        array_bit_size = 0;
                        array_cursor = *cursor;
                        array_cursor.n++;
                        array_cursor.stack[array_cursor.n - 1].bit_offset =
                            array_cursor.stack[array_cursor.n - 2].bit_offset;
                        for (i = 0; i < num_elements; i++)
                        {
                            int64_t element_bit_size;

                            array_cursor.stack[array_cursor.n - 1].type = (coda_dynamic_type *)array->base_type;
                            array_cursor.stack[array_cursor.n - 1].index = i;
                            if (coda_cursor_get_bit_size(&array_cursor, &element_bit_size) != 0)
                            {
                                return -1;
                            }
                            array_bit_size += element_bit_size;
                            array_cursor.stack[array_cursor.n - 1].bit_offset += element_bit_size;
                        }
                        *bit_size = array_bit_size;
                    }
                }
                break;
            default:
                assert(0);
                exit(1);
        }
    }

    return 0;
}